

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O0

Region * __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::detect(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
         *this,uint8_t *pixels,uint width,uint height,
        RegionAllocator<RegionDetector::Region> *regionAllocator)

{
  value_type pRVar1;
  uint uVar2;
  bool bVar3;
  undefined1 *puVar4;
  reference ppRVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  pointer *local_1988;
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  *local_1948;
  uint local_192c;
  uint i_1;
  uint newPixelGrayLevel;
  PixelAndEdgeType pe;
  uint previousLevel;
  value_type comp;
  int local_1904;
  pair<unsigned_int,_unsigned_char> local_1900;
  uint local_18f8;
  uint local_18f4;
  uint neighborLevel;
  uint neighborIdx;
  byte local_18e1;
  value_type pRStack_18e0;
  uchar currentEdge;
  undefined1 local_18d8 [8];
  Region rootRegion;
  uint currentLevel;
  uint currentIdx;
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  boundaryPixels [256];
  undefined1 local_60 [8];
  vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> componentStack;
  uint i;
  bool *accessible;
  int N_NEIGHBORS;
  RegionAllocator<RegionDetector::Region> *regionAllocator_local;
  uint height_local;
  uint width_local;
  uint8_t *pixels_local;
  RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
  *this_local;
  
  if ((width == 0) || (height == 0)) {
    return (Region *)0x0;
  }
  puVar4 = (undefined1 *)operator_new__((ulong)(width * height));
  if (puVar4 == (undefined1 *)0x0) {
    __assert_fail("accessible",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                  ,0x58,
                  "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                 );
  }
  for (componentStack.
       super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < width * height;
      componentStack.
      super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    puVar4[componentStack.
           super__Vector_base<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] = 0;
  }
  std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::vector
            ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)local_60
            );
  std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::reserve
            ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)local_60
             ,0x100);
  local_1948 = (vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                *)&currentLevel;
  do {
    std::
    vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ::vector(local_1948);
    local_1948 = local_1948 + 1;
  } while (local_1948 !=
           (vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
            *)&boundaryPixels[0xff].
               super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  rootRegion.next._4_4_ = 0;
  rootRegion.next._0_4_ = (uint)*pixels;
  *puVar4 = 1;
  Region::Region((Region *)local_18d8,0x100);
  pRStack_18e0 = (value_type)local_18d8;
  std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::push_back
            ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)local_60
             ,&stack0xffffffffffffe720);
LAB_001088e8:
  local_18e1 = 0;
  _neighborLevel =
       RegionAllocator<RegionDetector::Region>::new_(regionAllocator,(uint)rootRegion.next);
  std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::push_back
            ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)local_60
             ,(value_type *)&neighborLevel);
  ppRVar5 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                      ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                        *)local_60);
  if (*ppRVar5 == (value_type)0x0) {
    __assert_fail("componentStack.back() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                  ,0x6d,
                  "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                 );
  }
LAB_00108993:
  while (3 < local_18e1) {
    bVar3 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::empty
                      ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                        *)local_60);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!componentStack.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                    ,0x84,
                    "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                   );
    }
    ppRVar5 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::back
                        ((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                          *)local_60);
    Region::accumulate(*ppRVar5,rootRegion.next._4_4_,(uint)pixels[rootRegion.next._4_4_],width);
    uVar2 = (uint)rootRegion.next;
    while (bVar3 = std::
                   vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                   ::empty((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                            *)(&currentLevel + (ulong)(uint)rootRegion.next * 6)), bVar3) {
      rootRegion.next._0_4_ = (uint)rootRegion.next + 1;
      if (0xff < (uint)rootRegion.next) {
        sVar7 = std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
                size((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
                     local_60);
        if (sVar7 != 2) {
          __assert_fail("componentStack.size() == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                        ,0x8d,
                        "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                       );
        }
        local_192c = 0;
        while( true ) {
          if (width * height <= local_192c) {
            if (puVar4 != (undefined1 *)0x0) {
              operator_delete__(puVar4);
            }
            ppRVar5 = std::
                      vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
                      back((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>
                            *)local_60);
            pRVar1 = *ppRVar5;
            Region::~Region((Region *)local_18d8);
            local_1988 = &boundaryPixels[0xff].
                          super__Vector_base<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            do {
              local_1988 = local_1988 + -3;
              std::
              vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
              ::~vector((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                         *)local_1988);
            } while (local_1988 != (pointer *)&currentLevel);
            std::vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_>::
            ~vector((vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
                    local_60);
            return pRVar1;
          }
          if ((puVar4[local_192c] & 1) != 1) break;
          local_192c = local_192c + 1;
        }
        __assert_fail("accessible[i] == true",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0xaa,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
    }
    pvVar8 = std::
             vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
             ::back((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                     *)(&currentLevel + (ulong)(uint)rootRegion.next * 6));
    i_1 = (*pvVar8).first;
    rootRegion.next._4_4_ = i_1;
    newPixelGrayLevel._0_1_ = (*pvVar8).second;
    local_18e1 = (byte)newPixelGrayLevel;
    std::
    vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ::pop_back((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                *)(&currentLevel + (ulong)(uint)rootRegion.next * 6));
    rootRegion.next._0_4_ = (uint)pixels[rootRegion.next._4_4_];
    if ((uint)rootRegion.next != uVar2) {
      if ((uint)rootRegion.next <= uVar2) {
        __assert_fail("currentLevel > previousLevel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                      ,0x9f,
                      "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                     );
      }
      rootRegion.next._0_4_ = (uint)pixels[rootRegion.next._4_4_];
      processStack(this,(uint)pixels[rootRegion.next._4_4_],
                   (vector<RegionDetector::Region_*,_std::allocator<RegionDetector::Region_*>_> *)
                   local_60,regionAllocator);
    }
  }
  local_18f4 = getNeighborIdx(this,rootRegion.next._4_4_,width,height,(uint)local_18e1);
  if (width * height <= local_18f4) {
    __assert_fail("neighborIdx < width*height",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/RegionDetector/RegionDetector.hpp"
                  ,0x71,
                  "REGION_TYPE *RegionDetector::RegionDetectorDetector<RegionDetector::Region, RegionDetector::RegionAllocator<RegionDetector::Region>>::detect(const uint8_t *const, const unsigned int, const unsigned int, REGION_ALLOCATOR_TYPE *) [REGION_TYPE = RegionDetector::Region, REGION_ALLOCATOR_TYPE = RegionDetector::RegionAllocator<RegionDetector::Region>]"
                 );
  }
  if ((puVar4[local_18f4] & 1) == 0) {
    puVar4[local_18f4] = 1;
    local_18f8 = (uint)pixels[local_18f4];
    if (local_18f8 < (uint)rootRegion.next) goto code_r0x00108a4d;
    uVar6 = (ulong)local_18f8;
    comp._0_4_ = 0;
    std::pair<unsigned_int,_unsigned_char>::pair<int,_true>
              ((pair<unsigned_int,_unsigned_char> *)((long)&comp + 4),&local_18f4,(int *)&comp);
    std::
    vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
    ::push_back((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
                 *)(&currentLevel + uVar6 * 6),(value_type *)((long)&comp + 4));
  }
  local_18e1 = local_18e1 + 1;
  goto LAB_00108993;
code_r0x00108a4d:
  uVar6 = (ulong)(uint)rootRegion.next;
  local_1904 = local_18e1 + 1;
  std::pair<unsigned_int,_unsigned_char>::pair<unsigned_int_&,_int,_true>
            (&local_1900,(uint *)((long)&rootRegion.next + 4),&local_1904);
  std::
  vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
  ::push_back((vector<std::pair<unsigned_int,_unsigned_char>,_std::allocator<std::pair<unsigned_int,_unsigned_char>_>_>
               *)(&currentLevel + uVar6 * 6),&local_1900);
  rootRegion.next._4_4_ = local_18f4;
  rootRegion.next._0_4_ = local_18f8;
  goto LAB_001088e8;
}

Assistant:

REGION_TYPE* detect(uint8_t const * const pixels, const unsigned int width, const unsigned int height, REGION_ALLOCATOR_TYPE *regionAllocator) {

			// pixel index first, edge second
			typedef std::pair<unsigned int, unsigned char> PixelAndEdgeType;

			if (width == 0 || height == 0) {
				return nullptr;
			}

			const int N_NEIGHBORS = 4;

			// true if the pixel has already been accessed
			bool * const accessible = new bool[width*height];
			assert(accessible);
			for (unsigned int i = 0; i < width*height; i++) {
				accessible[i] = false;
			}

			std::vector<REGION_TYPE*> componentStack;
			componentStack.reserve(256);

			std::vector<PixelAndEdgeType> boundaryPixels[256];

			unsigned int currentIdx = 0;
			unsigned int currentLevel = pixels[currentIdx];

			accessible[currentIdx] = true;
			REGION_TYPE rootRegion(256);
			componentStack.push_back(&rootRegion);

			unsigned char currentEdge = 0;

		push_empty_component:
			componentStack.push_back(regionAllocator->new_(currentLevel));
			assert(componentStack.back() != nullptr);
		check_neighbors:
			for (; currentEdge < N_NEIGHBORS; currentEdge++) {
				const unsigned int neighborIdx = getNeighborIdx(currentIdx, width, height, currentEdge);
				assert(neighborIdx < width*height);
				if (!accessible[neighborIdx]) {
					accessible[neighborIdx] = true;
					unsigned int neighborLevel = pixels[neighborIdx];
					if (neighborLevel < currentLevel) {
						// neighbor is smaller, push this pixel back
						boundaryPixels[currentLevel].push_back(PixelAndEdgeType(currentIdx, currentEdge + 1));
						currentIdx = neighborIdx;
						currentLevel = neighborLevel;
						currentEdge = 0;
						goto push_empty_component;
					}
					else
					{
						boundaryPixels[neighborLevel].push_back(PixelAndEdgeType(neighborIdx, 0));
					}
				}
			}

			assert(!componentStack.empty());
			auto comp = componentStack.back();
			comp->accumulate(currentIdx, pixels[currentIdx], width);
			const unsigned int previousLevel = currentLevel;

			while (boundaryPixels[currentLevel].empty()) {
				currentLevel++;

				if (currentLevel > 255) {
					assert(componentStack.size() == 2);
					goto done;
				}
			}

			{
				PixelAndEdgeType pe = boundaryPixels[currentLevel].back();
				currentIdx = pe.first;
				currentEdge = pe.second;
			}
			boundaryPixels[currentLevel].pop_back();

			currentLevel = pixels[currentIdx];

			{
				unsigned int newPixelGrayLevel = pixels[currentIdx];

				if (currentLevel != previousLevel) {
					assert(currentLevel > previousLevel);
					currentLevel = newPixelGrayLevel;
					processStack(newPixelGrayLevel, componentStack, regionAllocator);
				}
			}
			goto check_neighbors;


		done:
			// all pixels must be accessible in the end
			for (unsigned int i = 0; i < width*height; i++) {
				assert(accessible[i] == true);
			}

			delete[] accessible;
			return componentStack.back();
		}